

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O2

void __thiscall
libtorrent::torrent_handle::
async_call<void(libtorrent::aux::torrent::*)(libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>),libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>&,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>&>
          (torrent_handle *this,offset_in_torrent_to_subr f,
          strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *a,
          strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *a_1)

{
  io_context *ctx;
  undefined1 *in_R8;
  shared_ptr<libtorrent::aux::torrent> t;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_60 [40];
  bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void> local_38;
  undefined1 local_34;
  
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_70,this);
  if (local_70._M_ptr != (element_type *)0x0) {
    local_60._0_8_ = ((local_70._M_ptr)->super_torrent_hot_members).m_ses;
    ctx = ((session_impl *)local_60._0_8_)->m_io_context;
    ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8),
               &local_70);
    local_38.m_val = *(uint *)a_1;
    local_34 = *in_R8;
    local_60._24_8_ = f;
    local_60._32_8_ = a;
    boost::asio::
    dispatch<boost::asio::io_context,libtorrent::torrent_handle::async_call<void(libtorrent::aux::torrent::*)(libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>),libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>&,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>&>(void(libtorrent::aux::torrent::*)(libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>),libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>&,libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>&)const::_lambda()_1_>
              (ctx,(type_conflict9 *)local_60,(type *)0x0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 0x10));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    return;
  }
  local_60._0_4_ = 0x14;
  aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
            ((error_code_enum *)local_60);
}

Assistant:

void torrent_handle::async_call(Fun f, Args&&... a) const
	{
		auto t = m_torrent.lock();
		if (!t) aux::throw_ex<system_error>(errors::invalid_torrent_handle);
		auto& ses = static_cast<session_impl&>(t->session());
		dispatch(ses.get_context(), [=,&ses] ()
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(t.get()->*f)(std::move(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (system_error const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, e.code(), e.what());
			} catch (std::exception const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), e.what());
			} catch (...) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), "unknown error");
			}
#endif
		} );
	}